

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_store_in_memory_unittest.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::TrustStoreInMemoryTest_OneRootTrusted_Test::TestBody
          (TrustStoreInMemoryTest_OneRootTrusted_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  CertificateTrust trust;
  TrustStoreInMemory in_memory;
  internal local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  string local_e8;
  string local_c8;
  CertificateTrust local_a8;
  shared_ptr<const_bssl::ParsedCertificate> local_a0;
  CertificateTrust local_90;
  TrustStoreInMemory local_88;
  
  TrustStoreInMemory::TrustStoreInMemory(&local_88);
  local_a0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_TrustStoreInMemoryTest).newroot_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (this->super_TrustStoreInMemoryTest).newroot_.
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (local_a0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  TrustStoreInMemory::AddTrustAnchor(&local_88,&local_a0);
  if (local_a0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_a8 = TrustStoreInMemory::GetTrust
                       (&local_88,
                        (this->super_TrustStoreInMemoryTest).newroot_.
                        super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
  local_90.type = LAST;
  local_90.enforce_anchor_expiry = false;
  local_90.enforce_anchor_constraints = false;
  local_90.require_anchor_basic_constraints = false;
  local_90.require_leaf_selfsigned = false;
  CertificateTrust::ToDebugString_abi_cxx11_(&local_e8,&local_90);
  CertificateTrust::ToDebugString_abi_cxx11_(&local_c8,&local_a8);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_f8,"CertificateTrust::ForTrustAnchor().ToDebugString()","trust.ToDebugString()",
             &local_e8,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_in_memory_unittest.cc"
               ,0x46,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((long *)local_e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_e8._M_dataplus._M_p + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_a8 = TrustStoreInMemory::GetTrust
                       (&local_88,
                        (this->super_TrustStoreInMemoryTest).oldroot_.
                        super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
  local_90.type = UNSPECIFIED;
  local_90.enforce_anchor_expiry = false;
  local_90.enforce_anchor_constraints = false;
  local_90.require_anchor_basic_constraints = false;
  local_90.require_leaf_selfsigned = false;
  CertificateTrust::ToDebugString_abi_cxx11_(&local_e8,&local_90);
  CertificateTrust::ToDebugString_abi_cxx11_(&local_c8,&local_a8);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_f8,"CertificateTrust::ForUnspecified().ToDebugString()","trust.ToDebugString()",
             &local_e8,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_in_memory_unittest.cc"
               ,0x4b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((long *)local_e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_e8._M_dataplus._M_p + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  TrustStoreInMemory::~TrustStoreInMemory(&local_88);
  return;
}

Assistant:

TEST_F(TrustStoreInMemoryTest, OneRootTrusted) {
  TrustStoreInMemory in_memory;
  in_memory.AddTrustAnchor(newroot_);

  // newroot_ is trusted.
  CertificateTrust trust = in_memory.GetTrust(newroot_.get());
  EXPECT_EQ(CertificateTrust::ForTrustAnchor().ToDebugString(),
            trust.ToDebugString());

  // oldroot_ is not.
  trust = in_memory.GetTrust(oldroot_.get());
  EXPECT_EQ(CertificateTrust::ForUnspecified().ToDebugString(),
            trust.ToDebugString());
}